

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

bool Js::InterpreterStackFrame::ShouldDoProfile(FunctionBody *executeFunction)

{
  Utf8SourceInfo *pUVar1;
  ExecutionMode EVar2;
  bool bVar3;
  
  EVar2 = FunctionBody::GetInterpreterExecutionMode(executeFunction,false);
  bVar3 = true;
  if (EVar2 != ProfilingInterpreter) {
    pUVar1 = (executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr
    ;
    if ((((pUVar1->debugModeSource).ptr != (uchar *)0x0) || ((pUVar1->field_0xa8 & 0x20) != 0)) &&
       ((pUVar1->field_0xa8 & 0x40) != 0)) {
      bVar3 = DynamicProfileInfo::IsEnabled(executeFunction);
      return bVar3;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool InterpreterStackFrame::ShouldDoProfile(FunctionBody* executeFunction)
    {
#if ENABLE_PROFILE_INFO
        const bool doProfile = executeFunction->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (executeFunction->IsInDebugMode() && DynamicProfileInfo::IsEnabled(executeFunction));
        return doProfile;
#else
        return false;
#endif
    }